

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.h
# Opt level: O3

void __thiscall crnlib::dxt5_block::flip_y(dxt5_block *this,uint w,uint h)

{
  byte bVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint bit_ofs;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  if (1 < h) {
    uVar12 = h * 0xc;
    uVar8 = 0;
    uVar10 = 0;
    do {
      uVar12 = uVar12 - 0xc;
      uVar13 = uVar12;
      uVar7 = uVar8;
      uVar11 = w;
      if (w != 0) {
        do {
          uVar9 = (ulong)(uVar7 >> 3);
          bVar1 = this->m_selectors[uVar9];
          uVar6 = (uint)bVar1;
          if (uVar7 < 0x28) {
            uVar6 = (uint)CONCAT11(this->m_selectors[uVar9 + 1],bVar1);
          }
          bVar3 = (byte)uVar7 & 7;
          uVar2 = (ulong)(uVar13 >> 3);
          uVar5 = (uint)this->m_selectors[uVar2];
          if (uVar13 < 0x28) {
            uVar5 = (uint)CONCAT11(this->m_selectors[uVar2 + 1],this->m_selectors[uVar2]);
          }
          bVar4 = (byte)uVar13 & 7;
          uVar5 = uVar5 >> bVar4 & 7;
          if (uVar7 < 0x28) {
            uVar5 = uVar5 << bVar3 |
                    ~(7 << bVar3) & (uint)CONCAT11(this->m_selectors[uVar9 + 1],bVar1);
            this->m_selectors[uVar9 + 1] = (uint8)(uVar5 >> 8);
          }
          else {
            uVar5 = uVar5 << bVar3 | (uint)bVar1 & ~(7 << bVar3);
          }
          uVar6 = uVar6 >> bVar3 & 7;
          this->m_selectors[uVar9] = (uint8)uVar5;
          if (uVar13 < 0x28) {
            uVar6 = uVar6 << bVar4 |
                    ~(7 << bVar4) &
                    (uint)CONCAT11(this->m_selectors[uVar2 + 1],this->m_selectors[uVar2]);
            this->m_selectors[uVar2 + 1] = (uint8)(uVar6 >> 8);
          }
          else {
            uVar6 = uVar6 << bVar4 | (uint)this->m_selectors[uVar2] & ~(7 << bVar4);
          }
          this->m_selectors[uVar2] = (uint8)uVar6;
          uVar7 = uVar7 + 3;
          uVar13 = uVar13 + 3;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      uVar10 = uVar10 + 1;
      uVar8 = uVar8 + 0xc;
    } while (uVar10 != h >> 1);
  }
  return;
}

Assistant:

inline void flip_y(uint w = 4, uint h = 4)
        {
            for (uint y = 0; y < (h / 2); y++)
            {
                for (uint x = 0; x < w; x++)
                {
                    const uint c = get_selector(x, y);
                    set_selector(x, y, get_selector(x, (h - 1) - y));
                    set_selector(x, (h - 1) - y, c);
                }
            }
        }